

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O2

void stack_init(lua_State *L1,lua_State *L)

{
  ulong *puVar1;
  ulong uVar2;
  
  puVar1 = (ulong *)lj_mem_realloc(L,(void *)0x0,0,0x178);
  (L1->stack).ptr64 = (uint64_t)puVar1;
  L1->stacksize = 0x2f;
  (L1->maxstack).ptr64 = (uint64_t)(puVar1 + 0x27);
  *puVar1 = (ulong)L1 | 0xfffc800000000000;
  puVar1[1] = 0xffffffffffffffff;
  L1->top = (TValue *)(puVar1 + 2);
  L1->base = (TValue *)(puVar1 + 2);
  for (uVar2 = 0x10; uVar2 < 0x178; uVar2 = uVar2 + 8) {
    *(undefined8 *)((long)puVar1 + uVar2) = 0xffffffffffffffff;
  }
  return;
}

Assistant:

static void stack_init(lua_State *L1, lua_State *L)
{
  TValue *stend, *st = lj_mem_newvec(L, LJ_STACK_START+LJ_STACK_EXTRA, TValue);
  setmref(L1->stack, st);
  L1->stacksize = LJ_STACK_START + LJ_STACK_EXTRA;
  stend = st + L1->stacksize;
  setmref(L1->maxstack, stend - LJ_STACK_EXTRA - 1);
  setthreadV(L1, st++, L1);  /* Needed for curr_funcisL() on empty stack. */
  if (LJ_FR2) setnilV(st++);
  L1->base = L1->top = st;
  while (st < stend)  /* Clear new slots. */
    setnilV(st++);
}